

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bag.cpp
# Opt level: O1

const_iterator __thiscall
minibag::Bag::checkField
          (Bag *this,M_string *fields,string *field,uint min_len,uint max_len,bool required)

{
  const_iterator cVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  long *plVar4;
  long *plVar5;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&fields->_M_t,field);
  if ((_Rb_tree_header *)cVar1._M_node == &(fields->_M_t)._M_impl.super__Rb_tree_header) {
    if (required) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_1d8,"Required \'",field);
      plVar4 = (long *)std::__cxx11::string::append((char *)&bStack_1d8);
      local_1b8 = (long *)*plVar4;
      plVar5 = plVar4 + 2;
      if (local_1b8 == plVar5) {
        local_1a8 = *plVar5;
        lStack_1a0 = plVar4[3];
        local_1b8 = &local_1a8;
      }
      else {
        local_1a8 = *plVar5;
      }
      local_1b0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::runtime_error::runtime_error(prVar3,(string *)&local_1b8);
      *(undefined ***)prVar3 = &PTR__runtime_error_00150718;
      __cxa_throw(prVar3,&BagFormatException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if ((cVar1._M_node[2]._M_parent < (_Base_ptr)(ulong)min_len) ||
          ((_Base_ptr)(ulong)max_len < cVar1._M_node[2]._M_parent)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Field \'",7);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1a8,(field->_M_dataplus)._M_p,field->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," is wrong size (",0x10);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," bytes)",7);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&bStack_1d8);
    *(undefined ***)prVar3 = &PTR__runtime_error_00150718;
    __cxa_throw(prVar3,&BagFormatException::typeinfo,std::runtime_error::~runtime_error);
  }
  return (const_iterator)cVar1._M_node;
}

Assistant:

M_string::const_iterator Bag::checkField(M_string const& fields, string const& field, unsigned int min_len, unsigned int max_len, bool required) const {
    M_string::const_iterator fitr = fields.find(field);
    if (fitr == fields.end()) {
        if (required)
            throw BagFormatException("Required '" + field + "' field missing");
    }
    else if ((fitr->second.size() < min_len) || (fitr->second.size() > max_len))
    {
        std::stringstream ss;
        ss << "Field '" << field << " is wrong size (" << (uint32_t) fitr->second.size() << " bytes)";
        throw BagFormatException(ss.str());
    }

    return fitr;
}